

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O0

uint32_t __thiscall
cubeb_resampler_speex_one_way<float>::input_needed_for_output
          (cubeb_resampler_speex_one_way<float> *this,int32_t output_frame_count)

{
  size_t sVar1;
  size_t sVar2;
  int in_ESI;
  long in_RDI;
  float fVar3;
  float input_frames_needed;
  int32_t resampled_frames_left;
  int32_t unresampled_frames_left;
  undefined4 local_4;
  
  sVar1 = auto_array<float>::length((auto_array<float> *)(in_RDI + 0x20));
  sVar1 = processor::samples_to_frames((processor *)(in_RDI + 8),sVar1);
  sVar2 = auto_array<float>::length((auto_array<float> *)(in_RDI + 0x38));
  sVar2 = processor::samples_to_frames((processor *)(in_RDI + 8),sVar2);
  fVar3 = (float)(in_ESI - (int)sVar1) * *(float *)(in_RDI + 0x18) + -(float)(int)sVar2;
  if (0.0 <= fVar3) {
    fVar3 = ceilf(fVar3);
    local_4 = (uint32_t)(long)fVar3;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t input_needed_for_output(int32_t output_frame_count) const
  {
    assert(output_frame_count >= 0); // Check overflow
    int32_t unresampled_frames_left =
        samples_to_frames(resampling_in_buffer.length());
    int32_t resampled_frames_left =
        samples_to_frames(resampling_out_buffer.length());
    float input_frames_needed =
        (output_frame_count - unresampled_frames_left) * resampling_ratio -
        resampled_frames_left;
    if (input_frames_needed < 0) {
      return 0;
    }
    return (uint32_t)ceilf(input_frames_needed);
  }